

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

uint Extra_TruthCanonN(uint uTruth,int nVars)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int Polarity;
  
  uVar3 = 0xffffffff;
  if (nVars != 0x1f) {
    iVar2 = 1 << ((byte)nVars & 0x1f);
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    Polarity = 0;
    do {
      uVar1 = Extra_TruthPolarize(uTruth,Polarity,nVars);
      if (uVar1 <= uVar3) {
        uVar3 = uVar1;
      }
      Polarity = Polarity + 1;
    } while (iVar2 != Polarity);
  }
  return uVar3;
}

Assistant:

unsigned Extra_TruthCanonN( unsigned uTruth, int nVars )
{
    unsigned uTruthMin, uPhase;
    int nMints, i;
    nMints    = (1 << nVars);
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        if ( uTruthMin > uPhase )
            uTruthMin = uPhase;
    }
    return uTruthMin;
}